

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserUtils.h
# Opt level: O2

bool ODDLParser::isInteger<char>(char *in,char *end)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  
  if (in != end) {
    in = in + (*in == '-');
  }
  bVar3 = false;
  do {
    bVar2 = isNotEndOfToken<char>(in,end);
    if (!bVar2) {
      return bVar3;
    }
    cVar1 = *in;
    in = in + 1;
    bVar3 = true;
  } while ((byte)(cVar1 - 0x30U) < 10);
  return false;
}

Assistant:

inline
bool isInteger( T *in, T *end ) {
    if( in != end ) {
        if( *in == '-' ) {
            ++in;
        }
    }

    bool result( false );
    while( isNotEndOfToken( in, end ) ) {
        result = isNumeric( *in );
        if( !result ) {
            break;
        }
        ++in;
    }

    return result;
}